

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# k_means_template.h
# Opt level: O2

void av1_k_means_dim1(int16_t *data,int16_t *centroids,uint8_t *indices,int n,int k,int max_itr)

{
  byte bVar1;
  int16_t *__s1;
  int16_t iVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  int64_t this_dist;
  int16_t *meta_centroids [2];
  uint8_t *meta_indices [2];
  int16_t centroids_tmp [8];
  int count [8];
  int centroids_sum [8];
  uint8_t indices_tmp [4096];
  long local_1100;
  uint local_10f4;
  int local_10f0;
  int local_10ec;
  size_t local_10e8;
  ulong local_10e0;
  int16_t *local_10d8 [4];
  uint8_t *local_10b8;
  size_t local_10b0;
  long local_10a8;
  ulong local_10a0;
  uint8_t *local_1098 [2];
  undefined1 local_1088 [16];
  int local_1078 [16];
  undefined1 local_1038 [4104];
  
  local_10d8[1] = (int16_t *)local_1088;
  local_1098[1] = local_1038;
  local_10d8[0] = centroids;
  local_10d8[3] = centroids;
  local_1098[0] = indices;
  (*av1_calc_indices_dim1)(data,centroids,indices,&local_1100,n,k);
  local_10b0 = (long)k * 4;
  uVar8 = 0;
  if (0 < n) {
    uVar8 = (ulong)(uint)n;
  }
  uVar9 = 0;
  if (0 < k) {
    uVar9 = (ulong)(uint)k;
  }
  local_10e8 = (long)k * 2;
  local_10f0 = 0;
  if (0 < max_itr) {
    local_10f0 = max_itr;
  }
  local_10b8 = indices;
  uVar7 = 0;
  iVar3 = 0;
  local_10ec = k;
  do {
    if (iVar3 == local_10f0) {
      uVar5 = (ulong)uVar7;
      uVar7 = 0;
      iVar3 = local_10f0;
LAB_001c5caf:
      uVar6 = (uint)uVar5;
      if (iVar3 != max_itr) {
        uVar6 = uVar7;
      }
      if (uVar6 != 0) {
        memcpy(local_10d8[3],local_1088,local_10e8);
        memcpy(local_10b8,local_1038,(long)n);
      }
      return;
    }
    local_10a8 = local_1100;
    local_10e0 = (ulong)(uVar7 ^ 1);
    __s1 = local_10d8[local_10e0];
    local_10a0 = (ulong)uVar7;
    local_1078[4] = 0;
    local_1078[5] = 0;
    local_1078[6] = 0;
    local_1078[7] = 0;
    local_1078[0] = 0;
    local_1078[1] = 0;
    local_1078[2] = 0;
    local_1078[3] = 0;
    uVar6 = (uint)*data;
    local_10f4 = uVar7;
    memset(local_1078 + 8,0,local_10b0);
    for (uVar5 = 0; uVar8 != uVar5; uVar5 = uVar5 + 1) {
      bVar1 = indices[uVar5];
      local_1078[bVar1] = local_1078[bVar1] + 1;
      local_1078[(ulong)bVar1 + 8] = local_1078[(ulong)bVar1 + 8] + (int)data[uVar5];
    }
    for (uVar5 = 0; uVar9 != uVar5; uVar5 = uVar5 + 1) {
      iVar4 = local_1078[uVar5];
      if (iVar4 == 0) {
        uVar6 = uVar6 * 0x41c64e6d + 0x3039;
        iVar2 = data[(ulong)(uVar6 >> 0x10 & 0x7fff) % (ulong)(uint)n];
      }
      else {
        iVar2 = (int16_t)(((iVar4 >> 1) + local_1078[uVar5 + 8]) / iVar4);
      }
      __s1[uVar5] = iVar2;
    }
    iVar4 = bcmp(__s1,local_10d8[local_10a0],local_10e8);
    uVar5 = local_10e0;
    if (iVar4 == 0) {
      uVar7 = 0;
      goto LAB_001c5caf;
    }
    indices = local_1098[local_10e0];
    (*av1_calc_indices_dim1)(data,__s1,indices,&local_1100,n,local_10ec);
    uVar7 = local_10f4;
    if (local_10a8 < local_1100) goto LAB_001c5caf;
    iVar3 = iVar3 + 1;
    uVar7 = (uint)uVar5;
  } while( true );
}

Assistant:

void RENAME(av1_k_means)(const int16_t *data, int16_t *centroids,
                         uint8_t *indices, int n, int k, int max_itr) {
  int16_t centroids_tmp[AV1_K_MEANS_DIM * PALETTE_MAX_SIZE];
  uint8_t indices_tmp[MAX_PALETTE_BLOCK_WIDTH * MAX_PALETTE_BLOCK_HEIGHT];
  int16_t *meta_centroids[2] = { centroids, centroids_tmp };
  uint8_t *meta_indices[2] = { indices, indices_tmp };
  int i, l = 0, prev_l, best_l = 0;
  int64_t this_dist;

  assert(n <= MAX_PALETTE_BLOCK_WIDTH * MAX_PALETTE_BLOCK_HEIGHT);

#if AV1_K_MEANS_DIM == 1
  av1_calc_indices_dim1(data, centroids, indices, &this_dist, n, k);
#else
  av1_calc_indices_dim2(data, centroids, indices, &this_dist, n, k);
#endif

  for (i = 0; i < max_itr; ++i) {
    const int64_t prev_dist = this_dist;
    prev_l = l;
    l = (l == 1) ? 0 : 1;

    RENAME(calc_centroids)(data, meta_centroids[l], meta_indices[prev_l], n, k);
    if (!memcmp(meta_centroids[l], meta_centroids[prev_l],
                sizeof(centroids[0]) * k * AV1_K_MEANS_DIM)) {
      break;
    }
#if AV1_K_MEANS_DIM == 1
    av1_calc_indices_dim1(data, meta_centroids[l], meta_indices[l], &this_dist,
                          n, k);
#else
    av1_calc_indices_dim2(data, meta_centroids[l], meta_indices[l], &this_dist,
                          n, k);
#endif

    if (this_dist > prev_dist) {
      best_l = prev_l;
      break;
    }
  }
  if (i == max_itr) best_l = l;
  if (best_l != 0) {
    memcpy(centroids, meta_centroids[1],
           sizeof(centroids[0]) * k * AV1_K_MEANS_DIM);
    memcpy(indices, meta_indices[1], sizeof(indices[0]) * n);
  }
}